

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bindTest.cpp
# Opt level: O2

bool blc::network::isPortFree(int port)

{
  int __fd;
  int iVar1;
  sockaddr_in addr;
  
  __fd = socket(2,1,0);
  addr.sin_family = 2;
  addr.sin_port = (ushort)port << 8 | (ushort)port >> 8;
  addr.sin_addr.s_addr = 0;
  iVar1 = bind(__fd,(sockaddr *)&addr,0x10);
  close(__fd);
  return iVar1 != -1;
}

Assistant:

bool blc::network::isPortFree(int port) {
	struct ::sockaddr_in addr;
		int sock = socket(PF_INET, SOCK_STREAM, 0);
		addr.sin_family = AF_INET;
		addr.sin_port = htons(port);
		addr.sin_addr.s_addr = htonl(INADDR_ANY);
		if (::bind(sock, (const struct sockaddr *)&addr, sizeof(struct sockaddr_in)) == -1) {
			close(sock);
			return (false);
		}
		close(sock);
		return (true);
}